

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_library
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *lib_info,ResourceTag tag,VkPipelineLibraryCreateInfoKHR **out_info)

{
  bool bVar1;
  SizeType SVar2;
  Type pGVar3;
  VkPipelineLibraryCreateInfoKHR *pVVar4;
  VkPipeline_T **out_pipeline;
  ValueIterator state;
  ValueIterator pGVar5;
  
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)lib_info,"libraries");
  pVVar4 = ScratchAllocator::allocate_cleared<VkPipelineLibraryCreateInfoKHR>(&this->allocator);
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(pGVar3);
  out_pipeline = ScratchAllocator::allocate_n<VkPipeline_T*>(&this->allocator,(ulong)SVar2);
  pVVar4->sType = VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR;
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(pGVar3);
  pVVar4->libraryCount = SVar2;
  pVVar4->pLibraries = out_pipeline;
  state = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Begin(pGVar3);
  while( true ) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(pGVar3);
    if (state == pGVar5) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(lib_info,"pNext");
      if (bVar1) {
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)lib_info,"pNext");
        bVar1 = parse_pnext_chain(this,pGVar3,&pVVar4->pNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar1) {
          return false;
        }
      }
      *out_info = pVVar4;
      return true;
    }
    bVar1 = parse_derived_pipeline_handle(this,iface,resolver,state,pipelines,tag,out_pipeline);
    if (!bVar1) break;
    state = state + 1;
    out_pipeline = out_pipeline + 1;
  }
  return false;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_library(
		StateCreatorInterface &iface, DatabaseInterface *resolver,
		const Value &pipelines,
		const Value &lib_info, ResourceTag tag,
		VkPipelineLibraryCreateInfoKHR **out_info)
{
	auto &library_list = lib_info["libraries"];
	auto *library_info = allocator.allocate_cleared<VkPipelineLibraryCreateInfoKHR>();
	auto *libraries = allocator.allocate_n<VkPipeline>(library_list.Size());

	library_info->sType = VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR;
	library_info->libraryCount = library_list.Size();
	library_info->pLibraries = libraries;

	for (auto itr = library_list.Begin(); itr != library_list.End(); ++itr, libraries++)
		if (!parse_derived_pipeline_handle(iface, resolver, *itr, pipelines, tag, libraries))
			return false;

	if (lib_info.HasMember("pNext"))
		if (!parse_pnext_chain(lib_info["pNext"], &library_info->pNext))
			return false;

	*out_info = library_info;
	return true;
}